

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportProperty.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::FBXExportProperty::DumpAscii
          (FBXExportProperty *this,StreamWriterLE *outstream,int indent)

{
  string local_1d0;
  locale local_1a0 [8];
  long local_198;
  ostringstream ss;
  int indent_local;
  StreamWriterLE *outstream_local;
  FBXExportProperty *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  std::locale::classic();
  std::ios::imbue(local_1a0);
  std::locale::~locale(local_1a0);
  std::ios_base::precision((ios_base *)((long)&local_198 + *(long *)(local_198 + -0x18)),0xf);
  DumpAscii(this,(ostream *)&local_198,indent);
  std::__cxx11::ostringstream::str();
  StreamWriter<false,_false>::PutString(outstream,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  return;
}

Assistant:

void FBXExportProperty::DumpAscii(Assimp::StreamWriterLE& outstream, int indent) {
    std::ostringstream ss;
    ss.imbue(std::locale::classic());
    ss.precision(15); // this seems to match official FBX SDK exports
    DumpAscii(ss, indent);
    outstream.PutString(ss.str());
}